

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O0

aiReturn __thiscall Assimp::ZipFile::Seek(ZipFile *this,size_t pOffset,aiOrigin pOrigin)

{
  aiOrigin pOrigin_local;
  size_t pOffset_local;
  ZipFile *this_local;
  
  if (pOrigin == aiOrigin_SET) {
    if (this->m_Size < pOffset) {
      this_local._4_4_ = aiReturn_FAILURE;
    }
    else {
      this->m_SeekPtr = pOffset;
      this_local._4_4_ = aiReturn_SUCCESS;
    }
  }
  else if (pOrigin == aiOrigin_CUR) {
    if (this->m_Size < pOffset + this->m_SeekPtr) {
      this_local._4_4_ = aiReturn_FAILURE;
    }
    else {
      this->m_SeekPtr = pOffset + this->m_SeekPtr;
      this_local._4_4_ = aiReturn_SUCCESS;
    }
  }
  else if (pOrigin == aiOrigin_END) {
    if (this->m_Size < pOffset) {
      this_local._4_4_ = aiReturn_FAILURE;
    }
    else {
      this->m_SeekPtr = this->m_Size - pOffset;
      this_local._4_4_ = aiReturn_SUCCESS;
    }
  }
  else {
    this_local._4_4_ = aiReturn_FAILURE;
  }
  return this_local._4_4_;
}

Assistant:

aiReturn ZipFile::Seek(size_t pOffset, aiOrigin pOrigin) {
        switch (pOrigin)
        {
        case aiOrigin_SET: {
            if (pOffset > m_Size) return aiReturn_FAILURE;
            m_SeekPtr = pOffset;
            return aiReturn_SUCCESS;
        }

        case aiOrigin_CUR: {
            if ((pOffset + m_SeekPtr) > m_Size) return aiReturn_FAILURE;
            m_SeekPtr += pOffset;
            return aiReturn_SUCCESS;
        }

        case aiOrigin_END: {
            if (pOffset > m_Size) return aiReturn_FAILURE;
            m_SeekPtr = m_Size - pOffset;
            return aiReturn_SUCCESS;
        }
        default:;
        }

        return aiReturn_FAILURE;
    }